

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_zero_block(aec_stream_conflict *strm)

{
  int *piVar1;
  internal_state_conflict *piVar2;
  internal_state_conflict *piVar3;
  uint32_t uVar4;
  int iVar5;
  code *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t *__s;
  uint uVar10;
  uint uVar11;
  
  piVar2 = strm->state;
  uVar4 = fs_ask(strm);
  if (uVar4 == 0) {
    iVar5 = 0;
  }
  else {
    uVar7 = piVar2->fs;
    uVar10 = uVar7 + 1;
    piVar3 = strm->state;
    piVar3->fs = 0;
    piVar1 = &piVar3->bitp;
    *piVar1 = *piVar1 + -1;
    if (uVar10 == 5) {
      __s = piVar2->rsip;
      uVar9 = (long)__s - (long)piVar2->rsi_buffer;
      uVar7 = strm->block_size;
      iVar5 = (int)((uVar9 >> 2 & 0xffffffff) / (ulong)uVar7);
      uVar11 = strm->rsi - iVar5;
      uVar10 = 0x40 - iVar5 % 0x40;
      if ((int)uVar11 < (int)uVar10) {
        uVar10 = uVar11;
      }
    }
    else {
      if (5 < uVar10) {
        uVar10 = uVar7;
      }
      uVar7 = strm->block_size;
      __s = piVar2->rsip;
      uVar9 = (long)__s - (long)piVar2->rsi_buffer;
    }
    uVar10 = uVar7 * uVar10 - piVar2->ref;
    uVar8 = (ulong)uVar10;
    if (piVar2->rsi_size - ((long)uVar9 >> 2) < uVar8) {
      iVar5 = -1;
    }
    else {
      uVar9 = (ulong)(piVar2->bytes_per_sample * uVar10);
      if (strm->avail_out < uVar9) {
        piVar2->sample_counter = uVar10;
        pcVar6 = m_zero_output;
      }
      else {
        memset(__s,0,uVar8 * 4);
        piVar2->rsip = piVar2->rsip + uVar8;
        strm->avail_out = strm->avail_out - uVar9;
        pcVar6 = m_next_cds;
      }
      piVar2->mode = pcVar6;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int m_zero_block(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    uint32_t zero_blocks;
    uint32_t zero_samples;
    uint32_t zero_bytes;

    if (fs_ask(strm) == 0)
        return M_EXIT;

    zero_blocks = state->fs + 1;
    fs_drop(strm);

    if (zero_blocks == ROS) {
        int b = (int)RSI_USED_SIZE(state) / strm->block_size;
        zero_blocks = MIN((int)(strm->rsi - b), 64 - (b % 64));
    } else if (zero_blocks > ROS) {
        zero_blocks--;
    }

    zero_samples = zero_blocks * strm->block_size - state->ref;
    if (state->rsi_size - RSI_USED_SIZE(state) < zero_samples)
        return M_ERROR;

    zero_bytes = zero_samples * state->bytes_per_sample;
    if (strm->avail_out >= zero_bytes) {
        memset(state->rsip, 0, zero_samples * sizeof(uint32_t));
        state->rsip += zero_samples;
        strm->avail_out -= zero_bytes;
        state->mode = m_next_cds;
    } else {
        state->sample_counter = zero_samples;
        state->mode = m_zero_output;
    }
    return M_CONTINUE;
}